

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,CNetAddr,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>,int>
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s,CAddress *args,
               CNetAddr *args_1,
               Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
               *args_2,int *args_3)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::
  SerializationOps<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress_const,ActionSerialize>
            (args,s);
  CNetAddr::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(args_1,s);
  Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>
  ::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            ((Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>
              *)args_2,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(s,*args_3);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}